

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

_Bool op_load_ri(DisasContext_conflict1 *s,arg_ldst_ri *a,MemOp mop,int mem_idx)

{
  TCGContext_conflict1 *s_00;
  undefined1 extraout_AL;
  TCGv_i32 a32;
  TCGTemp *pTVar1;
  TCGv_i32 val;
  ISSInfo issinfo;
  
  s_00 = s->uc->tcg_ctx;
  issinfo = ISSInvalid;
  if ((a->p != 0) && (a->w == 0)) {
    issinfo = a->rt | ISSIs16Bit;
    if ((s->base).pc_next - s->pc_curr != 2) {
      issinfo = a->rt;
    }
  }
  a32 = op_addr_ri_pre(s,a);
  pTVar1 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
  val = (TCGv_i32)((long)pTVar1 - (long)s_00);
  gen_aa32_ld_i32(s,val,a32,mem_idx,s->be_data | mop);
  disas_set_da_iss(s,mop,issinfo);
  op_addr_ri_post(s,a,a32,0);
  store_reg_from_load(s,a->rt,val);
  return (_Bool)extraout_AL;
}

Assistant:

static bool op_load_ri(DisasContext *s, arg_ldst_ri *a,
                       MemOp mop, int mem_idx)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    ISSInfo issinfo = make_issinfo(s, a->rt, a->p, a->w);
    TCGv_i32 addr, tmp;

    addr = op_addr_ri_pre(s, a);

    tmp = tcg_temp_new_i32(tcg_ctx);
    gen_aa32_ld_i32(s, tmp, addr, mem_idx, mop | s->be_data);
    disas_set_da_iss(s, mop, issinfo);

    /*
     * Perform base writeback before the loaded value to
     * ensure correct behavior with overlapping index registers.
     */
    op_addr_ri_post(s, a, addr, 0);
    store_reg_from_load(s, a->rt, tmp);
    return true;
}